

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# custom_settings.cpp
# Opt level: O1

void duckdb::SearchPathSetting::SetLocal(ClientContext *context,Value *input)

{
  ClientData *pCVar1;
  pointer this;
  string parameter;
  vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_> local_40;
  string local_28;
  
  Value::ToString_abi_cxx11_(&local_28,input);
  pCVar1 = ClientData::Get(context);
  this = unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>,_true>
         ::operator->(&pCVar1->catalog_search_path);
  CatalogSearchEntry::ParseList((vector<duckdb::CatalogSearchEntry,_true> *)&local_40,&local_28);
  CatalogSearchPath::Set(this,(vector<duckdb::CatalogSearchEntry,_true> *)&local_40,SET_SCHEMAS);
  ::std::vector<duckdb::CatalogSearchEntry,_std::allocator<duckdb::CatalogSearchEntry>_>::~vector
            (&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_28._M_dataplus._M_p != &local_28.field_2) {
    operator_delete(local_28._M_dataplus._M_p);
  }
  return;
}

Assistant:

void SearchPathSetting::SetLocal(ClientContext &context, const Value &input) {
	auto parameter = input.ToString();
	auto &client_data = ClientData::Get(context);
	client_data.catalog_search_path->Set(CatalogSearchEntry::ParseList(parameter), CatalogSetPathType::SET_SCHEMAS);
}